

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_sanitize_threed(REF_GRID ref_grid)

{
  REF_DBL *metric_00;
  REF_DBL *metric_01;
  REF_DBL *metric_02;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *metric;
  REF_DBL *metric_imply;
  REF_DBL *metric_orig;
  REF_GRID ref_grid_local;
  
  if (ref_grid->node->max * 6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x4c1,
           "ref_metric_sanitize_threed","malloc metric_orig of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    metric_00 = (REF_DBL *)malloc((long)(ref_grid->node->max * 6) << 3);
    if (metric_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x4c1,"ref_metric_sanitize_threed","malloc metric_orig of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else if (ref_grid->node->max * 6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x4c2,"ref_metric_sanitize_threed","malloc metric_imply of REF_DBL negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      metric_01 = (REF_DBL *)malloc((long)(ref_grid->node->max * 6) << 3);
      if (metric_01 == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x4c2,"ref_metric_sanitize_threed","malloc metric_imply of REF_DBL NULL");
        ref_grid_local._4_4_ = 2;
      }
      else if (ref_grid->node->max * 6 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x4c3,"ref_metric_sanitize_threed","malloc metric of REF_DBL negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        metric_02 = (REF_DBL *)malloc((long)(ref_grid->node->max * 6) << 3);
        if (metric_02 == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x4c3,"ref_metric_sanitize_threed","malloc metric of REF_DBL NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          ref_grid_local._4_4_ = ref_metric_from_node(metric_00,ref_grid->node);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_metric_imply_from(metric_01,ref_grid);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = ref_metric_smr(metric_01,metric_00,metric_02,ref_grid);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = ref_metric_imply_non_tet(metric_02,ref_grid);
                if (ref_grid_local._4_4_ == 0) {
                  ref_grid_local._4_4_ = ref_metric_to_node(metric_02,ref_grid->node);
                  if (ref_grid_local._4_4_ == 0) {
                    if (metric_02 != (REF_DBL *)0x0) {
                      free(metric_02);
                    }
                    if (metric_01 != (REF_DBL *)0x0) {
                      free(metric_01);
                    }
                    if (metric_00 != (REF_DBL *)0x0) {
                      free(metric_00);
                    }
                    ref_grid_local._4_4_ = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x4cd,"ref_metric_sanitize_threed",(ulong)ref_grid_local._4_4_,"to");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x4cb,"ref_metric_sanitize_threed",(ulong)ref_grid_local._4_4_,
                         "imply non tet");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x4c9,"ref_metric_sanitize_threed",(ulong)ref_grid_local._4_4_,"smr");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x4c7,"ref_metric_sanitize_threed",(ulong)ref_grid_local._4_4_,"imply");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x4c5,"ref_metric_sanitize_threed",(ulong)ref_grid_local._4_4_,"from");
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_sanitize_threed(REF_GRID ref_grid) {
  REF_DBL *metric_orig;
  REF_DBL *metric_imply;
  REF_DBL *metric;

  ref_malloc(metric_orig, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(metric_imply, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(metric, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  RSS(ref_metric_from_node(metric_orig, ref_grid_node(ref_grid)), "from");

  RSS(ref_metric_imply_from(metric_imply, ref_grid), "imply");

  RSS(ref_metric_smr(metric_imply, metric_orig, metric, ref_grid), "smr");

  RSS(ref_metric_imply_non_tet(metric, ref_grid), "imply non tet");

  RSS(ref_metric_to_node(metric, ref_grid_node(ref_grid)), "to");

  ref_free(metric);
  ref_free(metric_imply);
  ref_free(metric_orig);

  return REF_SUCCESS;
}